

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

natwm_error map_insert_entry(map *map,map_entry *entry)

{
  map_settings mVar1;
  map_entry *pmVar2;
  map_entry **__src;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  _Bool _Var6;
  natwm_error nVar7;
  size_t sVar8;
  map_entry **ppmVar9;
  void *__dest;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint32_t probe_position;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  double dVar19;
  undefined1 in_XMM2 [16];
  map_entry **local_40;
  
  do {
    uVar12 = (ulong)entry->hash % (ulong)map->length;
    pmVar2 = map->entries[uVar12];
    if (((pmVar2 == (map_entry *)0x0) || (pmVar2->key == (void *)0x0)) ||
       (bVar17 = true, (int *)pmVar2->value == &EMPTY_ENTRY)) {
      bVar17 = false;
    }
    sVar8 = (*map->key_size_function)(entry->key);
    if ((bVar17) && (_Var6 = (*map->key_compare_function)(entry->key,pmVar2->key,sVar8), _Var6)) {
      map_entry_destroy(map,pmVar2);
      map->entries[uVar12] = entry;
      goto LAB_0010a95b;
    }
    mVar1 = map->setting_flags;
    iVar10 = 0;
    if ((mVar1 & MAP_FLAG_IGNORE_THRESHOLDS) == 0) {
      auVar3 = vcvtusi2sd_avx512f(in_XMM2,map->bucket_count);
      auVar4 = vcvtusi2sd_avx512f(in_XMM2,map->length);
      dVar19 = (auVar3._0_8_ + 1.0) / auVar4._0_8_;
      iVar10 = 1;
      if ((dVar19 < 0.75) && (iVar10 = 0, dVar19 <= 0.2)) {
        iVar10 = ((mVar1 >> 5 & 1) != 0) - 1;
      }
    }
    if (iVar10 == -1) {
      uVar14 = map->length >> 1;
    }
    else {
      if (iVar10 != 1) {
        if (bVar17) {
          uVar14 = map->length;
          uVar13 = (ulong)uVar14;
          if (uVar14 < map->bucket_count + 1) {
            map_entry_destroy(map,entry);
            return CAPACITY_ERROR;
          }
          if (uVar14 != 0) {
            uVar16 = 0;
            break;
          }
          nVar7 = CAPACITY_ERROR;
          bVar17 = false;
          goto LAB_0010aa1d;
        }
        pmVar2 = map->entries[uVar12];
        if ((pmVar2 != (map_entry *)0x0) && ((int *)pmVar2->value == &EMPTY_ENTRY)) {
          map_entry_destroy(map,pmVar2);
        }
        map->entries[uVar12] = entry;
        goto LAB_0010a957;
      }
      uVar14 = map->length * 2;
    }
    ppmVar9 = (map_entry **)calloc((ulong)uVar14,8);
    local_40._0_4_ = MEMORY_ALLOCATION_ERROR;
    if (ppmVar9 != (map_entry **)0x0) {
      if ((mVar1 & MAP_FLAG_NO_LOCKING) == 0) {
        pthread_mutex_lock((pthread_mutex_t *)&map->mutex);
      }
      *(undefined1 *)&map->event_flags = (char)map->event_flags | EVENT_FLAG_RESIZING_MAP;
      uVar12 = (ulong)map->length;
      __dest = malloc(uVar12 * 8);
      if (__dest == (void *)0x0) {
        free(ppmVar9);
        local_40._0_4_ = MEMORY_ALLOCATION_ERROR;
      }
      else {
        __src = map->entries;
        memcpy(__dest,__src,uVar12 * 8);
        free(__src);
        map->length = uVar14;
        map->bucket_count = 0;
        map->entries = ppmVar9;
        bVar17 = uVar12 != 0;
        local_40 = ppmVar9;
        if (bVar17) {
          uVar13 = 1;
          do {
            pmVar2 = *(map_entry **)((long)__dest + uVar13 * 8 + -8);
            bVar18 = false;
            if (((pmVar2 != (map_entry *)0x0) && (pmVar2->key != (void *)0x0)) &&
               ((int *)pmVar2->value != &EMPTY_ENTRY)) {
              nVar7 = map_insert_entry(map,pmVar2);
              bVar18 = nVar7 != NO_ERROR;
              if (bVar18) {
                local_40._0_4_ = nVar7;
              }
              local_40 = (map_entry **)(ulong)(natwm_error)local_40;
            }
            if (bVar18) break;
            bVar17 = uVar13 < uVar12;
            bVar18 = uVar13 != uVar12;
            uVar13 = uVar13 + 1;
          } while (bVar18);
        }
        if (!bVar17) {
          free(__dest);
          *(undefined1 *)&map->event_flags = (char)map->event_flags & 0xfd;
          local_40._0_4_ = NO_ERROR;
          if ((map->setting_flags & MAP_FLAG_NO_LOCKING) == 0) {
            pthread_mutex_unlock((pthread_mutex_t *)&map->mutex);
            local_40._0_4_ = NO_ERROR;
          }
        }
      }
    }
    if ((natwm_error)local_40 != NO_ERROR) {
      return (natwm_error)local_40;
    }
  } while( true );
LAB_0010a97d:
  if ((uint)uVar13 <= (uint)uVar12) {
    uVar12 = 0;
  }
  ppmVar9 = map->entries;
  pmVar2 = ppmVar9[uVar12];
  if (((pmVar2 == (map_entry *)0x0) || (pmVar2->key == (void *)0x0)) ||
     (bVar17 = true, (int *)pmVar2->value == &EMPTY_ENTRY)) {
    bVar17 = false;
  }
  if (bVar17) {
    uVar15 = (uint)uVar12;
    iVar10 = (uint)uVar13 - uVar15;
    uVar14 = (uint)((ulong)entry->hash % uVar13);
    uVar5 = uVar15 - uVar14;
    if (uVar15 < uVar14) {
      uVar5 = uVar14 + iVar10;
    }
    uVar11 = (uint)((ulong)pmVar2->hash % uVar13);
    uVar14 = uVar15 - uVar11;
    if (uVar15 < uVar11) {
      uVar14 = iVar10 + uVar11;
    }
    if (uVar14 < uVar5) {
      ppmVar9[uVar12] = entry;
      entry = pmVar2;
    }
    uVar12 = (ulong)(uVar15 + 1);
  }
  else {
    ppmVar9[uVar12] = entry;
  }
  if (!bVar17) {
    nVar7 = NO_ERROR;
    goto LAB_0010aa19;
  }
  uVar16 = uVar16 + 1;
  uVar13 = (ulong)map->length;
  if (uVar13 <= uVar16) {
    nVar7 = CAPACITY_ERROR;
LAB_0010aa19:
    bVar17 = (bool)(bVar17 ^ 1);
LAB_0010aa1d:
    if (bVar17) {
LAB_0010a957:
      map->bucket_count = map->bucket_count + 1;
LAB_0010a95b:
      nVar7 = NO_ERROR;
    }
    return nVar7;
  }
  goto LAB_0010a97d;
}

Assistant:

static enum natwm_error map_insert_entry(struct map *map, struct map_entry *entry)
{
        // Get the new initial idex
        uint32_t initial_index = entry->hash % map->length;
        struct map_entry *present_entry = map->entries[initial_index];
        bool is_hash_collision = is_entry_present(present_entry);
        size_t key_size = map->key_size_function(entry->key);

        // If there is a collision with the same key overwrite it
        if (is_hash_collision
            && map->key_compare_function(entry->key, present_entry->key, key_size)) {
                map_entry_destroy(map, present_entry);

                map->entries[initial_index] = entry;

                return NO_ERROR;
        }

        // Now we need to increase map->bucket_count
        int resize_direction = get_resize_direction(map, map->bucket_count + 1.0);

        if (resize_direction != 0) {
                enum natwm_error resize_error = map_resize(map, resize_direction);

                if (resize_error != NO_ERROR) {
                        return resize_error;
                }

                // Insert with the new size
                return map_insert_entry(map, entry);
        }

        if (!is_hash_collision) {
                // No collision - just insert here
                if (map->entries[initial_index] != NULL
                    && map->entries[initial_index]->value == &EMPTY_ENTRY) {
                        // We previously had a value here - delete it and
                        // replace
                        map_entry_destroy(map, map->entries[initial_index]);
                }

                map->entries[initial_index] = entry;
                map->bucket_count += 1;

                return NO_ERROR;
        }

        if ((map->bucket_count + 1) > map->length) {
                map_entry_destroy(map, entry);

                return CAPACITY_ERROR;
        }

        // Handle collision
        enum natwm_error error = map_probe(map, entry, initial_index);

        if (error != NO_ERROR) {
                return error;
        }

        map->bucket_count += 1;

        return NO_ERROR;
}